

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt__GetGlyfOffset(stbtt_fontinfo *info,int glyph_index)

{
  stbtt_uint16 sVar1;
  stbtt_uint32 sVar2;
  int local_38;
  int local_24;
  int local_20;
  int g2;
  int g1;
  int glyph_index_local;
  stbtt_fontinfo *info_local;
  
  if ((info->cff).size != 0) {
    __assert_fail("!info->cff.size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                  ,0x624,"int stbtt__GetGlyfOffset(const stbtt_fontinfo *, int)");
  }
  if (glyph_index < info->numGlyphs) {
    if (info->indexToLocFormat < 2) {
      if (info->indexToLocFormat == 0) {
        local_20 = info->glyf;
        sVar1 = ttUSHORT(info->data + (long)(glyph_index << 1) + (long)info->loca);
        local_20 = local_20 + (uint)sVar1 * 2;
        local_24 = info->glyf;
        sVar1 = ttUSHORT(info->data + (long)(glyph_index << 1) + (long)info->loca + 2);
        local_24 = local_24 + (uint)sVar1 * 2;
      }
      else {
        local_20 = info->glyf;
        sVar2 = ttULONG(info->data + (long)(glyph_index << 2) + (long)info->loca);
        local_20 = local_20 + sVar2;
        local_24 = info->glyf;
        sVar2 = ttULONG(info->data + (long)(glyph_index << 2) + (long)info->loca + 4);
        local_24 = local_24 + sVar2;
      }
      if (local_20 == local_24) {
        local_38 = -1;
      }
      else {
        local_38 = local_20;
      }
      info_local._4_4_ = local_38;
    }
    else {
      info_local._4_4_ = -1;
    }
  }
  else {
    info_local._4_4_ = -1;
  }
  return info_local._4_4_;
}

Assistant:

static int stbtt__GetGlyfOffset(const stbtt_fontinfo *info, int glyph_index)
{
   int g1,g2;

   STBTT_assert(!info->cff.size);

   if (glyph_index >= info->numGlyphs) return -1; // glyph index out of range
   if (info->indexToLocFormat >= 2)    return -1; // unknown index->glyph map format

   if (info->indexToLocFormat == 0) {
      g1 = info->glyf + ttUSHORT(info->data + info->loca + glyph_index * 2) * 2;
      g2 = info->glyf + ttUSHORT(info->data + info->loca + glyph_index * 2 + 2) * 2;
   } else {
      g1 = info->glyf + ttULONG (info->data + info->loca + glyph_index * 4);
      g2 = info->glyf + ttULONG (info->data + info->loca + glyph_index * 4 + 4);
   }

   return g1==g2 ? -1 : g1; // if length is 0, return -1
}